

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O3

size_t BrotliZopfliComputeShortestPath
                 (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
                 size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                 int *dist_cache,H10 *hasher,ZopfliNode *nodes)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  size_t sVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint8_t *puVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  BackwardMatch *pBVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint8_t *puVar26;
  long lVar27;
  uint8_t *puVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ulong local_19c0;
  ulong local_19b8;
  ulong local_19b0;
  ulong local_1988;
  ulong local_1980;
  long local_1958;
  long local_1950;
  size_t local_1938;
  uint32_t auStack_1914 [41];
  StartPosQueue queue;
  BackwardMatch matches [128];
  ZopfliCostModel local_1368;
  
  uVar13 = 0x145;
  if (params->quality < 0xb) {
    uVar13 = 0x96;
  }
  local_1368.num_bytes_ = num_bytes;
  if (num_bytes < 0x80) {
    nodes->length = 0;
    (nodes->u).cost = 0.0;
    local_1938 = position;
  }
  else {
    local_1938 = (num_bytes + position) - 0x7f;
    local_1368.literal_costs_ = (float *)0x0;
    nodes->length = 0;
    (nodes->u).cost = 0.0;
    if (num_bytes == 0xfffffffffffffffe) goto LAB_0010e297;
  }
  local_1368.literal_costs_ = (float *)BrotliAllocate(m,(num_bytes + 2) * 4);
LAB_0010e297:
  ZopfliCostModelSetFromLiteralCosts(&local_1368,position,ringbuffer,ringbuffer_mask);
  queue.idx_ = 0;
  if (3 < num_bytes) {
    auStack_1914[0] = 0x80000000;
    auStack_1914[1] = 0x80000000;
    auStack_1914[2] = 0x80000000;
    sVar10 = 0;
    do {
      uVar19 = sVar10 + position;
      sVar18 = max_backward_limit;
      if (uVar19 < max_backward_limit) {
        sVar18 = uVar19;
      }
      uVar15 = num_bytes - sVar10;
      uVar5 = uVar19 & ringbuffer_mask;
      uVar6 = 0x10;
      if (params->quality == 0xb) {
        uVar6 = 0x40;
      }
      uVar7 = 0;
      if (uVar6 <= uVar19) {
        uVar7 = uVar19 - uVar6;
      }
      uVar12 = (sVar10 + position) - 1;
      uVar6 = 1;
      pBVar20 = matches;
      if (uVar7 < uVar12) {
        puVar14 = ringbuffer + uVar5;
        uVar9 = (ulong)((uint)uVar15 & 7);
        pBVar20 = matches;
        while (uVar19 - uVar12 <= sVar18) {
          uVar23 = uVar12 & ringbuffer_mask;
          if ((*puVar14 == ringbuffer[uVar23]) && (puVar14[1] == ringbuffer[uVar23 + 1])) {
            if (7 < uVar15) {
              lVar27 = 0;
              uVar16 = 0;
LAB_0010e3dd:
              if (*(ulong *)(puVar14 + uVar16 * 8) == *(ulong *)(ringbuffer + uVar16 * 8 + uVar23))
              goto code_r0x0010e3ea;
              uVar16 = *(ulong *)(ringbuffer + uVar16 * 8 + uVar23) ^
                       *(ulong *)(puVar14 + uVar16 * 8);
              uVar23 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              uVar16 = (uVar23 >> 3 & 0x1fffffff) - lVar27;
              goto LAB_0010e421;
            }
            uVar17 = 0;
            puVar28 = puVar14;
LAB_0010e459:
            uVar16 = uVar17;
            if (uVar9 != 0) {
              uVar24 = uVar9 | uVar17;
              uVar25 = uVar9;
              do {
                uVar16 = uVar17;
                if (ringbuffer[uVar17 + uVar23] != *puVar28) break;
                puVar28 = puVar28 + 1;
                uVar17 = uVar17 + 1;
                uVar25 = uVar25 - 1;
                uVar16 = uVar24;
              } while (uVar25 != 0);
            }
LAB_0010e421:
            if (uVar6 < uVar16) {
              pBVar20->distance = (uint32_t)(uVar19 - uVar12);
              pBVar20->length_and_code = (int)uVar16 << 5;
              pBVar20 = pBVar20 + 1;
              uVar6 = uVar16;
            }
          }
          uVar12 = uVar12 - 1;
          if ((uVar12 <= uVar7) || (2 < uVar6)) break;
        }
      }
      if (uVar6 < uVar15) {
        uVar3 = (uint)(*(int *)(ringbuffer + uVar5) * 0x1e35a7bd) >> 0xf;
        uVar12 = (ulong)hasher->buckets_[uVar3];
        uVar7 = uVar15;
        if (0x7f < uVar15) {
          hasher->buckets_[uVar3] = (uint32_t)uVar19;
          uVar7 = 0x80;
        }
        uVar9 = hasher->window_mask_;
        local_1958 = (uVar9 & uVar19) * 2 + 1;
        local_1950 = (uVar9 & uVar19) * 2;
        if (uVar19 != uVar12) {
          puVar14 = ringbuffer + uVar5;
          lVar27 = 0x40;
          local_1980 = 0;
          uVar23 = 0;
LAB_0010ed3b:
          bVar29 = lVar27 != 0;
          lVar27 = lVar27 + -1;
          if ((uVar19 - uVar12 <= sVar18) && (bVar29)) {
            uVar16 = local_1980;
            if (uVar23 < local_1980) {
              uVar16 = uVar23;
            }
            if (0x80 < uVar16) {
LAB_0010ef79:
              __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                            ,0x9d,
                            "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                           );
            }
            puVar26 = ringbuffer + (uVar12 & ringbuffer_mask);
            puVar28 = puVar26 + uVar16;
            uVar17 = uVar15 - uVar16;
            if (7 < uVar17) {
              uVar24 = uVar17 & 0xfffffffffffffff8;
              lVar21 = 0;
              uVar25 = 0;
LAB_0010edb7:
              if (*(ulong *)(puVar28 + uVar25 * 8) == *(ulong *)(puVar14 + uVar25 * 8 + uVar16))
              goto code_r0x0010edc4;
              uVar25 = *(ulong *)(puVar14 + uVar25 * 8 + uVar16) ^ *(ulong *)(puVar28 + uVar25 * 8);
              uVar17 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                }
              }
              uVar25 = (uVar17 >> 3 & 0x1fffffff) - lVar21;
              goto LAB_0010ede6;
            }
            uVar24 = 0;
            goto LAB_0010eecb;
          }
        }
LAB_0010e4f9:
        if (0x7f < uVar15) {
          uVar1 = hasher->invalid_pos_;
          puVar2 = hasher->forest_;
          puVar2[local_1950] = uVar1;
          puVar2[local_1958] = uVar1;
        }
      }
LAB_0010e529:
      lVar27 = 3;
      auVar30 = _DAT_00139170;
      auVar31 = _DAT_00139160;
      do {
        if (SUB164(auVar30 ^ _DAT_00139180,4) == -0x80000000 &&
            SUB164(auVar30 ^ _DAT_00139180,0) < -0x7fffffda) {
          auStack_1914[lVar27] = 0xfffffff;
          auStack_1914[lVar27 + 1] = 0xfffffff;
        }
        if (SUB164(auVar31 ^ _DAT_00139180,4) == -0x80000000 &&
            SUB164(auVar31 ^ _DAT_00139180,0) < -0x7fffffda) {
          auStack_1914[lVar27 + 2] = 0xfffffff;
          auStack_1914[lVar27 + 3] = 0xfffffff;
        }
        lVar21 = auVar30._8_8_;
        auVar30._0_8_ = auVar30._0_8_ + 4;
        auVar30._8_8_ = lVar21 + 4;
        lVar21 = auVar31._8_8_;
        auVar31._0_8_ = auVar31._0_8_ + 4;
        auVar31._8_8_ = lVar21 + 4;
        lVar27 = lVar27 + 4;
      } while (lVar27 != 0x2b);
      uVar6 = uVar6 + 1;
      if (uVar6 < 5) {
        uVar6 = 4;
      }
      iVar4 = BrotliFindAllStaticDictionaryMatches(ringbuffer + uVar5,uVar6,uVar15,auStack_1914 + 3)
      ;
      if (iVar4 != 0) {
        if (0x24 < uVar15) {
          uVar15 = 0x25;
        }
        if (uVar6 <= uVar15) {
          iVar4 = (int)uVar6 << 5;
          do {
            uVar3 = auStack_1914[uVar6 + 3];
            if (uVar3 < 0xfffffff) {
              uVar11 = uVar3 & 0x1f;
              pBVar20->distance = (uVar3 >> 5) + (int)sVar18 + 1;
              if (uVar6 == uVar11) {
                uVar11 = 0;
              }
              pBVar20->length_and_code = uVar11 + iVar4;
              pBVar20 = pBVar20 + 1;
            }
            uVar6 = uVar6 + 1;
            iVar4 = iVar4 + 0x20;
          } while (uVar15 + 1 != uVar6);
        }
      }
      if ((long)pBVar20 - (long)matches == 0) {
        sVar18 = 0;
      }
      else {
        sVar18 = (long)pBVar20 - (long)matches >> 3;
        if (uVar13 < pBVar20[-1].length_and_code >> 5) {
          matches[0] = matches[sVar18 - 1];
          sVar18 = 1;
        }
      }
      sVar8 = UpdateNodes(num_bytes,position,sVar10,ringbuffer,ringbuffer_mask,
                          (BrotliEncoderParams *)(ulong)(uint)params->quality,max_backward_limit,
                          dist_cache,sVar18,matches,&local_1368,&queue,nodes);
      local_1988 = 0;
      if (0x3fff < sVar8) {
        local_1988 = sVar8;
      }
      if (sVar18 == 1) {
        uVar3 = matches[0].length_and_code >> 5;
        if ((uVar13 < uVar3) && (local_1988 < uVar3)) {
          local_1988 = (ulong)uVar3;
        }
      }
      sVar18 = sVar10;
      if (1 < local_1988) {
        uVar5 = uVar19 + 1;
        uVar6 = local_1988 + uVar19;
        if (local_1938 <= local_1988 + uVar19) {
          uVar6 = local_1938;
        }
        uVar15 = uVar6 - 0x3f;
        if (uVar6 < uVar19 + 0x40) {
          uVar15 = uVar5;
        }
        if ((uVar19 + 0x201 <= uVar15) && (uVar5 < uVar15)) {
          uVar19 = hasher->window_mask_;
          do {
            uVar3 = (uint)(*(int *)(ringbuffer + (uVar5 & ringbuffer_mask)) * 0x1e35a7bd) >> 0xf;
            uVar7 = (ulong)hasher->buckets_[uVar3];
            local_19c0 = (uVar19 & uVar5) * 2 + 1;
            local_19b0 = (uVar19 & uVar5) * 2;
            hasher->buckets_[uVar3] = (uint32_t)uVar5;
            if (uVar5 != uVar7) {
              puVar14 = ringbuffer + (uVar5 & ringbuffer_mask);
              lVar27 = 0x40;
              uVar12 = 0;
              uVar9 = 0;
LAB_0010e898:
              bVar29 = lVar27 != 0;
              lVar27 = lVar27 + -1;
              if ((uVar5 - uVar7 <= uVar19 - 0xf) && (bVar29)) {
                uVar23 = uVar12;
                if (uVar9 < uVar12) {
                  uVar23 = uVar9;
                }
                if (uVar23 < 0x81) {
                  puVar26 = ringbuffer + (uVar7 & ringbuffer_mask);
                  puVar28 = puVar26 + uVar23;
                  uVar16 = 0x80 - uVar23;
                  if (uVar23 < 0x79) {
                    uVar25 = (ulong)((uint)uVar16 & 0xf8);
                    lVar21 = 0;
                    uVar17 = 0;
LAB_0010e90b:
                    if (*(ulong *)(puVar28 + uVar17 * 8) ==
                        *(ulong *)(puVar14 + uVar17 * 8 + uVar23)) goto code_r0x0010e918;
                    uVar17 = *(ulong *)(puVar14 + uVar17 * 8 + uVar23) ^
                             *(ulong *)(puVar28 + uVar17 * 8);
                    uVar16 = 0;
                    if (uVar17 != 0) {
                      for (; (uVar17 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                      }
                    }
                    uVar17 = (uVar16 >> 3 & 0x1fffffff) - lVar21;
                    goto LAB_0010e944;
                  }
                  uVar25 = 0;
                  goto LAB_0010e9dc;
                }
                goto LAB_0010ef79;
              }
            }
LAB_0010e84e:
            uVar1 = hasher->invalid_pos_;
            puVar2 = hasher->forest_;
            puVar2[local_19b0] = uVar1;
            puVar2[local_19c0] = uVar1;
LAB_0010e86b:
            uVar5 = uVar5 + 8;
          } while (uVar5 < uVar15);
        }
        if (uVar15 < uVar6) {
          uVar19 = hasher->window_mask_;
          do {
            uVar11 = (uint)(*(int *)(ringbuffer + (uVar15 & ringbuffer_mask)) * 0x1e35a7bd) >> 0xf;
            uVar3 = hasher->buckets_[uVar11];
            uVar5 = (ulong)uVar3;
            local_19b8 = (uVar19 & uVar15) * 2 + 1;
            local_19c0 = (uVar19 & uVar15) * 2;
            hasher->buckets_[uVar11] = (uint32_t)uVar15;
            if (uVar15 != uVar5) {
              puVar14 = ringbuffer + (uVar15 & ringbuffer_mask);
              lVar27 = 0x40;
              uVar7 = 0;
              uVar12 = 0;
LAB_0010eae9:
              bVar29 = lVar27 != 0;
              lVar27 = lVar27 + -1;
              if ((uVar15 - uVar5 <= uVar19 - 0xf) && (bVar29)) {
                uVar9 = uVar7;
                if (uVar12 < uVar7) {
                  uVar9 = uVar12;
                }
                if (uVar9 < 0x81) {
                  puVar26 = ringbuffer + (uVar5 & ringbuffer_mask);
                  puVar28 = puVar26 + uVar9;
                  uVar23 = 0x80 - uVar9;
                  if (uVar9 < 0x79) {
                    uVar17 = (ulong)((uint)uVar23 & 0xf8);
                    lVar21 = 0;
                    uVar16 = 0;
LAB_0010eb5c:
                    if (*(ulong *)(puVar28 + uVar16 * 8) == *(ulong *)(puVar14 + uVar16 * 8 + uVar9)
                       ) goto code_r0x0010eb69;
                    uVar16 = *(ulong *)(puVar14 + uVar16 * 8 + uVar9) ^
                             *(ulong *)(puVar28 + uVar16 * 8);
                    uVar23 = 0;
                    if (uVar16 != 0) {
                      for (; (uVar16 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                      }
                    }
                    uVar16 = (uVar23 >> 3 & 0x1fffffff) - lVar21;
                    goto LAB_0010eb8b;
                  }
                  uVar17 = 0;
                  goto LAB_0010ec2b;
                }
                goto LAB_0010ef79;
              }
            }
LAB_0010eaa0:
            uVar1 = hasher->invalid_pos_;
            puVar2 = hasher->forest_;
            puVar2[local_19c0] = uVar1;
            puVar2[local_19b8] = uVar1;
LAB_0010eabd:
            uVar15 = uVar15 + 1;
          } while (uVar15 < uVar6);
        }
        lVar27 = local_1988 - 1;
        uVar19 = sVar10 + 4;
        do {
          sVar18 = uVar19 - 3;
          if (num_bytes <= uVar19) break;
          EvaluateNode(position,sVar18,max_backward_limit,dist_cache,&local_1368,&queue,nodes);
          uVar19 = uVar19 + 1;
          lVar27 = lVar27 + -1;
        } while (lVar27 != 0);
      }
      sVar10 = sVar18 + 1;
    } while (sVar18 + 4 < num_bytes);
  }
  BrotliFree(m,local_1368.literal_costs_);
  sVar10 = ComputeShortestPathFromNodes(num_bytes,nodes);
  return sVar10;
code_r0x0010e3ea:
  uVar16 = uVar16 + 1;
  lVar27 = lVar27 + -8;
  uVar17 = uVar15 & 0xfffffffffffffff8;
  puVar28 = puVar14 + (uVar15 & 0xfffffffffffffff8);
  if (uVar15 >> 3 == uVar16) goto LAB_0010e459;
  goto LAB_0010e3dd;
code_r0x0010edc4:
  uVar25 = uVar25 + 1;
  lVar21 = lVar21 + -8;
  if (uVar17 >> 3 == uVar25) goto code_r0x0010edd0;
  goto LAB_0010edb7;
code_r0x0010edd0:
  puVar28 = puVar28 + -lVar21;
LAB_0010eecb:
  uVar17 = uVar17 & 7;
  uVar25 = uVar24;
  if (uVar17 != 0) {
    uVar22 = uVar24 | uVar17;
    do {
      uVar25 = uVar24;
      if (puVar14[uVar24 + uVar16] != *puVar28) break;
      puVar28 = puVar28 + 1;
      uVar24 = uVar24 + 1;
      uVar17 = uVar17 - 1;
      uVar25 = uVar22;
    } while (uVar17 != 0);
  }
LAB_0010ede6:
  uVar25 = uVar25 + uVar16;
  iVar4 = bcmp(puVar14,puVar26,uVar25);
  if (iVar4 != 0) {
LAB_0010ef98:
    __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                  ,0xa2,
                  "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                 );
  }
  if (pBVar20 == (BackwardMatch *)0x0) {
    pBVar20 = (BackwardMatch *)0x0;
  }
  else if (uVar6 < uVar25) {
    pBVar20->distance = (uint32_t)(uVar19 - uVar12);
    pBVar20->length_and_code = (int)uVar25 << 5;
    pBVar20 = pBVar20 + 1;
    uVar6 = uVar25;
  }
  if (uVar7 <= uVar25) {
    if (0x7f < uVar15) {
      puVar2 = hasher->forest_;
      puVar2[local_1950] = puVar2[(uVar12 & uVar9) * 2];
      puVar2[local_1958] = puVar2[(uVar12 & uVar9) * 2 + 1];
    }
    goto LAB_0010e529;
  }
  puVar2 = hasher->forest_;
  if (puVar26[uVar25] < puVar14[uVar25]) {
    if (0x7f < uVar15) {
      puVar2[local_1950] = (uint32_t)uVar12;
    }
    lVar21 = (uVar12 & uVar9) * 2 + 1;
    uVar23 = uVar25;
    local_1950 = lVar21;
  }
  else {
    if (0x7f < uVar15) {
      puVar2[local_1958] = (uint32_t)uVar12;
    }
    lVar21 = (uVar12 & uVar9) * 2;
    local_1980 = uVar25;
    local_1958 = lVar21;
  }
  uVar12 = (ulong)puVar2[lVar21];
  if (uVar19 == uVar12) goto LAB_0010e4f9;
  goto LAB_0010ed3b;
code_r0x0010e918:
  uVar17 = uVar17 + 1;
  lVar21 = lVar21 + -8;
  if (uVar16 >> 3 == uVar17) goto code_r0x0010e924;
  goto LAB_0010e90b;
code_r0x0010e924:
  puVar28 = puVar28 + -lVar21;
LAB_0010e9dc:
  uVar16 = uVar16 & 7;
  uVar17 = uVar25;
  if (uVar16 != 0) {
    uVar24 = uVar25 | uVar16;
    do {
      uVar17 = uVar25;
      if (puVar14[uVar25 + uVar23] != *puVar28) break;
      puVar28 = puVar28 + 1;
      uVar25 = uVar25 + 1;
      uVar16 = uVar16 - 1;
      uVar17 = uVar24;
    } while (uVar16 != 0);
  }
LAB_0010e944:
  uVar17 = uVar17 + uVar23;
  iVar4 = bcmp(puVar14,puVar26,uVar17);
  if (iVar4 != 0) goto LAB_0010ef98;
  if (0x7f < uVar17) {
    puVar2 = hasher->forest_;
    puVar2[local_19b0] = puVar2[(uVar7 & uVar19) * 2];
    puVar2[local_19c0] = puVar2[(uVar7 & uVar19) * 2 + 1];
    goto LAB_0010e86b;
  }
  uVar23 = (uVar7 & uVar19) * 2;
  puVar2 = hasher->forest_;
  if (puVar26[uVar17] < puVar14[uVar17]) {
    puVar2[local_19b0] = (uint32_t)uVar7;
    uVar23 = uVar23 | 1;
    uVar9 = uVar17;
    local_19b0 = uVar23;
  }
  else {
    puVar2[local_19c0] = (uint32_t)uVar7;
    uVar12 = uVar17;
    local_19c0 = uVar23;
  }
  uVar7 = (ulong)puVar2[uVar23];
  if (uVar5 == uVar7) goto LAB_0010e84e;
  goto LAB_0010e898;
code_r0x0010eb69:
  uVar16 = uVar16 + 1;
  lVar21 = lVar21 + -8;
  if (uVar23 >> 3 == uVar16) goto code_r0x0010eb75;
  goto LAB_0010eb5c;
code_r0x0010eb75:
  puVar28 = puVar28 + -lVar21;
LAB_0010ec2b:
  uVar23 = uVar23 & 7;
  uVar16 = uVar17;
  if (uVar23 != 0) {
    uVar25 = uVar17 | uVar23;
    do {
      uVar16 = uVar17;
      if (puVar14[uVar17 + uVar9] != *puVar28) break;
      puVar28 = puVar28 + 1;
      uVar17 = uVar17 + 1;
      uVar23 = uVar23 - 1;
      uVar16 = uVar25;
    } while (uVar23 != 0);
  }
LAB_0010eb8b:
  uVar16 = uVar16 + uVar9;
  iVar4 = bcmp(puVar14,puVar26,uVar16);
  if (iVar4 != 0) goto LAB_0010ef98;
  if (0x7f < uVar16) {
    puVar2 = hasher->forest_;
    puVar2[local_19c0] = puVar2[(uVar5 & uVar19) * 2];
    puVar2[local_19b8] = puVar2[(uVar5 & uVar19) * 2 + 1];
    goto LAB_0010eabd;
  }
  uVar5 = (uVar5 & uVar19) * 2;
  puVar2 = hasher->forest_;
  if (puVar26[uVar16] < puVar14[uVar16]) {
    puVar2[local_19c0] = uVar3;
    uVar5 = uVar5 | 1;
    uVar12 = uVar16;
    local_19c0 = uVar5;
  }
  else {
    puVar2[local_19b8] = uVar3;
    uVar7 = uVar16;
    local_19b8 = uVar5;
  }
  uVar3 = puVar2[uVar5];
  uVar5 = (ulong)uVar3;
  if (uVar15 == uVar5) goto LAB_0010eaa0;
  goto LAB_0010eae9;
}

Assistant:

size_t BrotliZopfliComputeShortestPath(MemoryManager* m,
                                       size_t num_bytes,
                                       size_t position,
                                       const uint8_t* ringbuffer,
                                       size_t ringbuffer_mask,
                                       const BrotliEncoderParams* params,
                                       const size_t max_backward_limit,
                                       const int* dist_cache,
                                       H10* hasher,
                                       ZopfliNode* nodes) {
  const size_t max_zopfli_len = MaxZopfliLen(params);
  ZopfliCostModel model;
  StartPosQueue queue;
  BackwardMatch matches[MAX_NUM_MATCHES_H10];
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t i;
  nodes[0].length = 0;
  nodes[0].u.cost = 0;
  InitZopfliCostModel(m, &model, num_bytes);
  if (BROTLI_IS_OOM(m)) return 0;
  ZopfliCostModelSetFromLiteralCosts(
      &model, position, ringbuffer, ringbuffer_mask);
  InitStartPosQueue(&queue);
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; i++) {
    const size_t pos = position + i;
    const size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t num_matches = FindAllMatchesH10(hasher, ringbuffer, ringbuffer_mask,
        pos, num_bytes - i, max_distance, params, matches);
    size_t skip;
    if (num_matches > 0 &&
        BackwardMatchLength(&matches[num_matches - 1]) > max_zopfli_len) {
      matches[0] = matches[num_matches - 1];
      num_matches = 1;
    }
    skip = UpdateNodes(num_bytes, position, i, ringbuffer, ringbuffer_mask,
        params, max_backward_limit, dist_cache, num_matches, matches, &model,
        &queue, nodes);
    if (skip < BROTLI_LONG_COPY_QUICK_STEP) skip = 0;
    if (num_matches == 1 && BackwardMatchLength(&matches[0]) > max_zopfli_len) {
      skip = BROTLI_MAX(size_t, BackwardMatchLength(&matches[0]), skip);
    }
    if (skip > 1) {
      /* Add the tail of the copy to the hasher. */
      StoreRangeH10(hasher, ringbuffer, ringbuffer_mask, pos + 1, BROTLI_MIN(
          size_t, pos + skip, store_end));
      skip--;
      while (skip) {
        i++;
        if (i + HashTypeLengthH10() - 1 >= num_bytes) break;
        EvaluateNode(
            position, i, max_backward_limit, dist_cache, &model, &queue, nodes);
        skip--;
      }
    }
  }
  CleanupZopfliCostModel(m, &model);
  return ComputeShortestPathFromNodes(num_bytes, nodes);
}